

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module * lys_parse_mem_(ly_ctx *ctx,char *data,LYS_INFORMAT format,int internal)

{
  lys_ext *plVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  lys_module *module;
  lys_ext_instance **pplVar6;
  lys_ext_instance *plVar7;
  void *pvVar8;
  void *pvVar9;
  LY_ERR *pLVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  
  ly_err_clean(1);
  if (ctx == (ly_ctx *)0x0 || data == (char *)0x0) {
    pLVar10 = ly_errno_location();
    *pLVar10 = LY_EINVAL;
    pcVar5 = "%s: Invalid parameter.";
LAB_0014fb14:
    ly_log(LY_LLERR,pcVar5,"lys_parse_mem_");
    return (lys_module *)0x0;
  }
  if (format == LYS_IN_YANG && internal == 0) {
    sVar4 = strlen(data);
    pcVar5 = (char *)malloc((ulong)((int)sVar4 + 2));
    if (pcVar5 == (char *)0x0) {
      pLVar10 = ly_errno_location();
      *pLVar10 = LY_EMEM;
      pcVar5 = "Memory allocation failed (%s()).";
      goto LAB_0014fb14;
    }
    memcpy(pcVar5,data,sVar4 & 0xffffffff);
    pcVar5[(int)sVar4 + 1] = '\0';
    pcVar5[sVar4 & 0xffffffff] = '\0';
    data = pcVar5;
  }
  else {
    if (format != LYS_IN_YANG) {
      if (format == LYS_IN_YIN) {
        pcVar5 = (char *)0x0;
        module = yin_read_module(ctx,data,(char *)0x0,1);
      }
      else {
        pLVar10 = ly_errno_location();
        *pLVar10 = LY_EINVAL;
        pcVar5 = (char *)0x0;
        ly_log(LY_LLERR,"Invalid schema input format.");
        module = (lys_module *)0x0;
      }
      goto LAB_0014fb9d;
    }
    pcVar5 = (char *)0x0;
  }
  module = yang_read_module(ctx,data,0,(char *)0x0,1);
LAB_0014fb9d:
  free(pcVar5);
  if (module != (lys_module *)0x0) {
    iVar3 = ly_strequal_(module->name,"ietf-netconf");
    if (iVar3 == 0) {
      return module;
    }
    pplVar6 = (lys_ext_instance **)realloc(module->ext,(ulong)module->ext_size * 8 + 0x18);
    if (pplVar6 != (lys_ext_instance **)0x0) {
      module->ext = pplVar6;
      plVar7 = (lys_ext_instance *)calloc(1,0x6a);
      pplVar6[module->ext_size] = plVar7;
      pcVar5 = lydict_insert(ctx,"operation",9);
      plVar7->arg_value = pcVar5;
      plVar1 = (*(ctx->models).list)->extensions;
      plVar7->def = plVar1;
      plVar7->parent = module;
      plVar7[1].parent = module;
      plVar7->parent_type = '\0';
      plVar7->ext_type = '\x01';
      plVar7[1].def = *(lys_ext **)(plVar1->plugin + 1);
      *(undefined4 *)&plVar7[1].arg_value = 0x10000;
      pvVar8 = calloc(1,0x40);
      *(void **)((long)&plVar7[1].arg_value + 4) = pvVar8;
      *(undefined4 *)((long)pvVar8 + 8) = 6;
      *(lys_tpdf **)((long)pvVar8 + 0x18) = ly_types[6];
      *(lys_ext_instance **)((long)pvVar8 + 0x20) = plVar7;
      *(undefined4 *)((long)pvVar8 + 0x30) = 5;
      pvVar9 = calloc(5,0x30);
      *(void **)((long)pvVar8 + 0x28) = pvVar9;
      *(undefined4 *)((long)pvVar9 + 0x1c) = 0;
      pcVar5 = lydict_insert(ctx,"merge",5);
      **(undefined8 **)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) = pcVar5;
      *(undefined4 *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x4c) = 1;
      pcVar5 = lydict_insert(ctx,"replace",7);
      *(char **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x30) = pcVar5;
      *(undefined4 *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x7c) = 2;
      pcVar5 = lydict_insert(ctx,"create",6);
      *(char **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x60) = pcVar5;
      *(undefined4 *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0xac) = 3;
      pcVar5 = lydict_insert(ctx,"delete",6);
      *(char **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x90) = pcVar5;
      *(undefined4 *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0xdc) = 4;
      pcVar5 = lydict_insert(ctx,"remove",6);
      *(char **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0xc0) = pcVar5;
      bVar11 = module->ext_size + 1;
      module->ext_size = bVar11;
      plVar7 = (lys_ext_instance *)calloc(1,0x6a);
      module->ext[bVar11] = plVar7;
      pcVar5 = lydict_insert(ctx,"type",4);
      plVar7->arg_value = pcVar5;
      plVar1 = (*(ctx->models).list)->extensions;
      plVar7->def = plVar1;
      plVar7->parent = module;
      plVar7[1].parent = module;
      plVar7->parent_type = '\0';
      plVar7->ext_type = '\x01';
      plVar7[1].def = *(lys_ext **)(plVar1->plugin + 1);
      *(undefined4 *)&plVar7[1].arg_value = 0x10000;
      pvVar8 = calloc(1,0x40);
      *(void **)((long)&plVar7[1].arg_value + 4) = pvVar8;
      *(undefined4 *)((long)pvVar8 + 8) = 6;
      *(lys_tpdf **)((long)pvVar8 + 0x18) = ly_types[6];
      *(lys_ext_instance **)((long)pvVar8 + 0x20) = plVar7;
      *(undefined4 *)((long)pvVar8 + 0x30) = 2;
      pvVar9 = calloc(2,0x30);
      *(void **)((long)pvVar8 + 0x28) = pvVar9;
      *(undefined4 *)((long)pvVar9 + 0x1c) = 0;
      pcVar5 = lydict_insert(ctx,"subtree",7);
      **(undefined8 **)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) = pcVar5;
      *(undefined4 *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x4c) = 1;
      pcVar5 = lydict_insert(ctx,"xpath",5);
      *(char **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x30) = pcVar5;
      lVar12 = (ulong)module->features_size + 1;
      lVar2 = (ulong)module->features_size << 6;
      do {
        lVar13 = lVar2;
        if (lVar12 + -1 == 0 || lVar12 < 1) goto LAB_0014ff41;
        iVar3 = strcmp(*(char **)(module->features[-1].padding + lVar13 + -0x1c),"xpath");
        lVar12 = lVar12 + -1;
        lVar2 = lVar13 + -0x40;
      } while (iVar3 != 0);
      lVar12 = *(long *)((long)&plVar7[1].arg_value + 4);
      *(undefined1 *)(*(long *)(lVar12 + 0x28) + 0x4b) = 1;
      pvVar8 = calloc(1,0x40);
      *(void **)(*(long *)(lVar12 + 0x28) + 0x58) = pvVar8;
      pvVar8 = malloc(1);
      **(undefined8 **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x58) = pvVar8
      ;
      *(undefined1 *)
       **(undefined8 **)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x58) = 3;
      pvVar8 = malloc(8);
      *(void **)(*(long *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x58) +
                0x10) = pvVar8;
      **(long **)(*(long *)(*(long *)(*(long *)((long)&plVar7[1].arg_value + 4) + 0x28) + 0x58) +
                 0x10) = (long)(module->features[-1].padding + lVar13 + -0x1c);
LAB_0014ff41:
      bVar11 = module->ext_size + 1;
      module->ext_size = bVar11;
      plVar7 = (lys_ext_instance *)calloc(1,0x6a);
      module->ext[bVar11] = plVar7;
      pcVar5 = lydict_insert(ctx,"select",6);
      plVar7->arg_value = pcVar5;
      plVar1 = (*(ctx->models).list)->extensions;
      plVar7->def = plVar1;
      plVar7->parent = module;
      plVar7[1].parent = module;
      plVar7->parent_type = '\0';
      plVar7->ext_type = '\x01';
      plVar7[1].def = *(lys_ext **)(plVar1->plugin + 1);
      *(undefined4 *)&plVar7[1].arg_value = 0x10000;
      pvVar8 = calloc(1,0x40);
      *(void **)((long)&plVar7[1].arg_value + 4) = pvVar8;
      *(undefined4 *)((long)pvVar8 + 8) = 10;
      *(lys_tpdf **)((long)pvVar8 + 0x18) = ly_types[10];
      *(lys_ext_instance **)((long)pvVar8 + 0x20) = plVar7;
      module->ext_size = module->ext_size + '\x01';
      return module;
    }
    pLVar10 = ly_errno_location();
    *pLVar10 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_parse_mem_");
    lys_free(module,(_func_void_lys_node_ptr_void_ptr *)0x0,1);
  }
  return (lys_module *)0x0;
}

Assistant:

static const struct lys_module *
lys_parse_mem_(struct ly_ctx *ctx, const char *data, LYS_INFORMAT format, int internal)
{
    char *enlarged_data = NULL;
    struct lys_module *mod = NULL;
    unsigned int len;
    void *reallocated;
    struct lys_ext_instance_complex *op;
    struct lys_type **type;
    int i;

    ly_err_clean(1);

    if (!ctx || !data) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    if (!internal && format == LYS_IN_YANG) {
        /* enlarge data by 2 bytes for flex */
        len = strlen(data);
        enlarged_data = malloc((len + 2) * sizeof *enlarged_data);
        if (!enlarged_data) {
            LOGMEM;
            return NULL;
        }
        memcpy(enlarged_data, data, len);
        enlarged_data[len] = enlarged_data[len + 1] = '\0';
        data = enlarged_data;
    }

    switch (format) {
    case LYS_IN_YIN:
        mod = yin_read_module(ctx, data, NULL, 1);
        break;
    case LYS_IN_YANG:
        mod = yang_read_module(ctx, data, 0, NULL, 1);
        break;
    default:
        LOGERR(LY_EINVAL, "Invalid schema input format.");
        break;
    }

    free(enlarged_data);

    /* hack for NETCONF's edit-config's operation attribute. It is not defined in the schema, but since libyang
     * implements YANG metadata (annotations), we need its definition. Because the ietf-netconf schema is not the
     * internal part of libyang, we cannot add the annotation into the schema source, but we do it here to have
     * the anotation definitions available in the internal schema structure. There is another hack in schema
     * printers to do not print this internally added annotation. */
    if (mod && ly_strequal(mod->name, "ietf-netconf", 0)) {
        reallocated = realloc(mod->ext, (mod->ext_size + 3) * sizeof *mod->ext);
        if (!reallocated) {
            LOGMEM;
            lys_free(mod, NULL, 1);
            return NULL;
        }
        mod->ext = reallocated;
        /* 1) edit-config's operation */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "operation", 9);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_ENUM;
        (*type)->der = ly_types[LY_TYPE_ENUM];
        (*type)->parent = (struct lys_tpdf *)op;
        (*type)->info.enums.count = 5;
        (*type)->info.enums.enm = calloc(5, sizeof *(*type)->info.enums.enm);
        (*type)->info.enums.enm[0].value = 0;
        (*type)->info.enums.enm[0].name = lydict_insert(ctx, "merge", 5);
        (*type)->info.enums.enm[1].value = 1;
        (*type)->info.enums.enm[1].name = lydict_insert(ctx, "replace", 7);
        (*type)->info.enums.enm[2].value = 2;
        (*type)->info.enums.enm[2].name = lydict_insert(ctx, "create", 6);
        (*type)->info.enums.enm[3].value = 3;
        (*type)->info.enums.enm[3].name = lydict_insert(ctx, "delete", 6);
        (*type)->info.enums.enm[4].value = 4;
        (*type)->info.enums.enm[4].name = lydict_insert(ctx, "remove", 6);
        mod->ext_size++;

        /* 2) filter's type */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "type", 4);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_ENUM;
        (*type)->der = ly_types[LY_TYPE_ENUM];
        (*type)->parent = (struct lys_tpdf *)op;
        (*type)->info.enums.count = 2;
        (*type)->info.enums.enm = calloc(2, sizeof *(*type)->info.enums.enm);
        (*type)->info.enums.enm[0].value = 0;
        (*type)->info.enums.enm[0].name = lydict_insert(ctx, "subtree", 7);
        (*type)->info.enums.enm[1].value = 1;
        (*type)->info.enums.enm[1].name = lydict_insert(ctx, "xpath", 5);
        for (i = mod->features_size; i > 0; i--) {
            if (!strcmp(mod->features[i - 1].name, "xpath")) {
                (*type)->info.enums.enm[1].iffeature_size = 1;
                (*type)->info.enums.enm[1].iffeature = calloc(1, sizeof(struct lys_feature));
                (*type)->info.enums.enm[1].iffeature[0].expr = malloc(sizeof(uint8_t));
                *(*type)->info.enums.enm[1].iffeature[0].expr = 3; /* LYS_IFF_F */
                (*type)->info.enums.enm[1].iffeature[0].features = malloc(sizeof(struct lys_feature*));
                (*type)->info.enums.enm[1].iffeature[0].features[0] = &mod->features[i - 1];
                break;
            }
        }
        mod->ext_size++;

        /* 3) filter's select */
        op = calloc(1, sizeof(struct lys_ext_instance_complex) + 5 * sizeof(void*) + sizeof(uint16_t));
        mod->ext[mod->ext_size] = (struct lys_ext_instance *)op;
        op->arg_value = lydict_insert(ctx, "select", 6);
        op->def = &ctx->models.list[0]->extensions[0];
        op->ext_type = LYEXT_COMPLEX;
        op->module = op->parent = mod;
        op->parent_type = LYEXT_PAR_MODULE;
        op->substmt = ((struct lyext_plugin_complex *)op->def->plugin)->substmt;
        op->nodetype = LYS_EXT;
        type = (struct lys_type**)&op->content; /* type is stored at offset 0 */
        *type = calloc(1, sizeof(struct lys_type));
        (*type)->base = LY_TYPE_STRING;
        (*type)->der = ly_types[LY_TYPE_STRING];
        (*type)->parent = (struct lys_tpdf *)op;
        mod->ext_size++;
    }

    return mod;
}